

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O3

REF_STATUS ref_matrix_solve_ab(REF_INT rows,REF_INT cols,REF_DBL *ab)

{
  ulong uVar1;
  double dVar2;
  undefined8 uVar3;
  double dVar4;
  bool bVar5;
  ulong uVar6;
  byte bVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  REF_DBL *pRVar11;
  long lVar12;
  double *pdVar13;
  uint uVar14;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  REF_DBL *pRVar22;
  ulong uVar23;
  int iVar24;
  ulong uVar25;
  double *pdVar26;
  REF_DBL RVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  double dVar31;
  double dVar32;
  long local_68;
  long local_48;
  double *local_40;
  ulong uVar15;
  
  if (rows < 1) {
    iVar8 = 0;
  }
  else {
    uVar6 = (ulong)(uint)rows;
    lVar9 = (long)cols;
    uVar17 = (ulong)(uint)cols;
    lVar18 = uVar6 * 8 + 8;
    uVar25 = 1;
    local_68 = 0;
    local_48 = 8;
    lVar21 = 0;
    uVar23 = 0;
    bVar7 = 0;
    uVar15 = 0;
    local_40 = ab;
    do {
      uVar14 = (uint)uVar15;
      dVar2 = ab[uVar15 + (long)(int)(uVar14 * rows)];
      uVar1 = uVar15 + 1;
      uVar10 = uVar14;
      if (uVar1 < uVar6) {
        dVar30 = dVar2;
        if (dVar2 <= -dVar2) {
          dVar30 = -dVar2;
        }
        uVar16 = uVar15 & 0xffffffff;
        uVar20 = uVar25;
        do {
          dVar31 = ab[uVar23 + uVar20];
          if (dVar31 <= -dVar31) {
            dVar31 = -dVar31;
          }
          if (dVar30 < dVar31) {
            uVar16 = uVar20 & 0xffffffff;
          }
          uVar10 = (uint)uVar16;
          if (dVar31 <= dVar30) {
            dVar31 = dVar30;
          }
          dVar30 = dVar31;
          uVar20 = uVar20 + 1;
        } while (uVar6 != uVar20);
      }
      if ((long)uVar15 < lVar9 && uVar15 != uVar10) {
        lVar12 = local_68 + (long)(int)uVar10 * 8;
        pRVar11 = ab;
        uVar20 = uVar17;
        do {
          uVar3 = *(undefined8 *)((long)pRVar11 + lVar12);
          *(undefined8 *)((long)pRVar11 + lVar12) = *(undefined8 *)((long)pRVar11 + lVar21);
          *(undefined8 *)((long)pRVar11 + lVar21) = uVar3;
          pRVar11 = pRVar11 + uVar6;
          uVar20 = uVar20 - 1;
        } while (uVar20 != 0);
        dVar2 = ab[uVar15 + (long)(int)(uVar14 * rows)];
      }
      if ((long)uVar15 < lVar9) {
        dVar30 = dVar2 * 1e+20;
        if (dVar30 <= -dVar30) {
          dVar30 = -dVar30;
        }
        pdVar26 = local_40;
        uVar20 = uVar17;
        dVar31 = dVar2;
        if (dVar2 <= -dVar2) {
          dVar31 = -dVar2;
        }
        do {
          dVar4 = *pdVar26;
          dVar32 = dVar4;
          if (dVar4 <= -dVar4) {
            dVar32 = -dVar4;
          }
          if (dVar30 <= dVar32) {
            return 4;
          }
          if (dVar31 < 1e-13) {
            bVar7 = 1;
          }
          *pdVar26 = dVar4 / dVar2;
          uVar20 = uVar20 - 1;
          pdVar26 = pdVar26 + uVar6;
        } while (uVar20 != 0);
      }
      if (uVar1 < uVar6) {
        lVar12 = local_48;
        uVar20 = uVar25;
        do {
          if ((long)uVar15 < lVar9) {
            dVar2 = ab[uVar14 * rows + uVar20];
            uVar16 = uVar17;
            pRVar11 = ab;
            do {
              *(double *)((long)pRVar11 + lVar12) =
                   *(double *)((long)pRVar11 + lVar12) - *(double *)((long)pRVar11 + lVar21) * dVar2
              ;
              pRVar11 = pRVar11 + uVar6;
              uVar16 = uVar16 - 1;
            } while (uVar16 != 0);
          }
          uVar20 = uVar20 + 1;
          lVar12 = lVar12 + 8;
        } while (uVar20 != uVar6);
      }
      uVar25 = uVar25 + 1;
      uVar23 = (ulong)(uint)((int)uVar23 + rows);
      lVar21 = lVar21 + lVar18;
      local_68 = local_68 + uVar6 * 8;
      uVar17 = uVar17 - 1;
      local_40 = local_40 + uVar6 + 1;
      local_48 = local_48 + lVar18;
      uVar15 = uVar1;
    } while (uVar1 != uVar6);
    iVar8 = (uint)bVar7 << 3;
  }
  if (rows < cols) {
    lVar21 = (long)rows;
    lVar9 = (lVar21 * 8 + 8) * lVar21;
    pRVar11 = (REF_DBL *)((long)ab + lVar9);
    lVar18 = lVar21;
    do {
      if (0 < rows) {
        iVar24 = 0;
        pRVar22 = pRVar11;
        lVar12 = lVar21;
        pdVar26 = (double *)((long)ab + lVar9 + -8);
        do {
          RVar27 = ab[lVar18 * lVar21 + lVar12 + -1];
          if (lVar12 < lVar21) {
            lVar19 = 0;
            pdVar13 = pdVar26;
            do {
              RVar27 = RVar27 - *pdVar13 * pRVar22[lVar19];
              lVar19 = lVar19 + 1;
              pdVar13 = pdVar13 + lVar21;
            } while (iVar24 != (int)lVar19);
          }
          lVar19 = lVar12 + -1;
          auVar28._0_8_ = ab[(rows + 1) * (int)lVar19] * 1e+20;
          auVar28._8_8_ = RVar27;
          auVar29._8_8_ = -RVar27;
          auVar29._0_8_ = -auVar28._0_8_;
          auVar29 = maxpd(auVar28,auVar29);
          if (auVar29._0_8_ <= auVar29._8_8_) {
            return 4;
          }
          ab[lVar18 * lVar21 + lVar19] = RVar27 / ab[(rows + 1) * (int)lVar19];
          pRVar22 = pRVar22 + -1;
          pdVar26 = (double *)((long)pdVar26 + (lVar21 * 8 ^ 0xfffffffffffffff8U));
          iVar24 = iVar24 + 1;
          bVar5 = 1 < lVar12;
          lVar12 = lVar19;
        } while (bVar5);
      }
      lVar18 = lVar18 + 1;
      pRVar11 = pRVar11 + lVar21;
    } while ((int)lVar18 != cols);
  }
  return iVar8;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_solve_ab(REF_INT rows, REF_INT cols,
                                       REF_DBL *ab) {
  REF_INT row, col;
  REF_INT i, j, k;
  REF_INT pivot_row;
  REF_DBL largest_pivot, pivot;
  REF_DBL temp;
  REF_DBL factor;
  REF_DBL rhs;
  REF_BOOL ill_condition = REF_FALSE;

  for (col = 0; col < rows; col++) {
    /* find largest pivot */
    pivot_row = col;
    largest_pivot = ABS(ab[pivot_row + rows * col]);
    for (i = col + 1; i < rows; i++) {
      pivot = ABS(ab[i + rows * col]);
      if (pivot > largest_pivot) {
        largest_pivot = pivot;
        pivot_row = i;
      }
    }

    /* exchange rows to get the best pivot on the diagonal,
       unless it is already there */
    if (pivot_row != col)
      for (j = col; j < cols; j++) {
        temp = ab[pivot_row + j * rows];
        ab[pivot_row + j * rows] = ab[col + j * rows];
        ab[col + j * rows] = temp;
      }

    /* normalize pivot row */
    pivot = ab[col + rows * col];
    for (j = col; j < cols; j++) {
      if (!ref_math_divisible(ab[col + j * rows], pivot)) {
        return REF_DIV_ZERO;
      }
      if (ABS(pivot) < 1.0e-13) {
        ill_condition = REF_TRUE;
      }
      ab[col + j * rows] /= pivot;
    }

    /* eliminate sub diagonal terms */
    for (i = col + 1; i < rows; i++) {
      factor = ab[i + col * rows];
      for (j = col; j < cols; j++)
        ab[i + j * rows] -= ab[col + j * rows] * factor;
    }
  }

  for (col = rows; col < cols; col++)
    for (row = rows - 1; row > -1; row--) {
      rhs = ab[row + col * rows];
      for (k = row + 1; k < rows; k++)
        rhs -= ab[row + k * rows] * ab[k + col * rows];
      if (!ref_math_divisible(rhs, ab[row + row * rows])) return REF_DIV_ZERO;
      ab[row + col * rows] = rhs / ab[row + row * rows];
    }

  return (ill_condition ? REF_ILL_CONDITIONED : REF_SUCCESS);
}